

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
cfd::core::ConfidentialTransaction::GetTxOutIndexList
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ConfidentialTransaction *this,Script *locking_script)

{
  __type _Var1;
  bool bVar2;
  size_type sVar3;
  const_reference this_00;
  undefined8 uVar4;
  Script *in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffef0;
  value_type_conflict1 vVar5;
  CfdError error_code;
  CfdException *this_01;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  Script local_b0;
  string local_78;
  value_type_conflict1 local_58 [2];
  uint32_t index;
  undefined1 local_48 [8];
  string search_str;
  Script *locking_script_local;
  ConfidentialTransaction *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  search_str.field_2._M_local_buf[0xf] = '\0';
  this_01 = (CfdException *)__return_storage_ptr__;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4a969c);
  Script::GetHex_abi_cxx11_((string *)local_48,locking_script);
  local_58[0] = 0;
  while (vVar5 = local_58[0],
        sVar3 = ::std::
                vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ::size(&this->vout_), vVar5 < (uint)sVar3) {
    this_00 = ::std::
              vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
              operator[](&this->vout_,(ulong)local_58[0]);
    AbstractTxOut::GetLockingScript(&local_b0,&this_00->super_AbstractTxOut);
    Script::GetHex_abi_cxx11_(&local_78,&local_b0);
    _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__return_storage_ptr__);
    in_stack_fffffffffffffef0 = CONCAT13(_Var1,(int3)in_stack_fffffffffffffef0);
    ::std::__cxx11::string::~string((string *)&local_78);
    Script::~Script(in_stack_fffffffffffffee0);
    if ((in_stack_fffffffffffffef0 & 0x1000000) != 0) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,local_58);
    }
    local_58[0] = local_58[0] + 1;
  }
  bVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(__return_storage_ptr__);
  error_code = (CfdError)((ulong)__return_storage_ptr__ >> 0x20);
  if (bVar2) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x5d6;
    local_c8.funcname = "GetTxOutIndexList";
    logger::warn<>(&local_c8,"locking script is not found.");
    uVar4 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e8,"locking script is not found.",&local_e9);
    CfdException::CfdException
              (this_01,error_code,(string *)CONCAT44(vVar5,in_stack_fffffffffffffef0));
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  search_str.field_2._M_local_buf[0xf] = '\x01';
  ::std::__cxx11::string::~string((string *)local_48);
  if ((search_str.field_2._M_local_buf[0xf] & 1U) == 0) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(vVar5,in_stack_fffffffffffffef0));
  }
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
}

Assistant:

std::vector<uint32_t> ConfidentialTransaction::GetTxOutIndexList(
    const Script &locking_script) const {
  std::vector<uint32_t> result;
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    if (search_str == vout_[index].GetLockingScript().GetHex()) {
      result.push_back(index);
    }
  }
  if (result.empty()) {
    warn(CFD_LOG_SOURCE, "locking script is not found.");
    throw CfdException(
        kCfdIllegalArgumentError, "locking script is not found.");
  }
  return result;
}